

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Ga2_ManComputeTest(Gia_Man_t *p)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int level;
  undefined8 uVar4;
  uint uVar5;
  long lVar6;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  lVar6 = -1;
  lVar2 = -1;
  if (-1 < iVar1) {
    lVar2 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  uVar3 = 0;
  Ga2_ManMarkup(p,5,0);
  uVar4 = 3;
  iVar1 = clock_gettime(3,&local_30);
  if (-1 < iVar1) {
    lVar6 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print((int)uVar4,"%s =","Time");
  Abc_Print((int)uVar4,"%9.2f sec\n",(double)(lVar6 - lVar2) / 1000000.0);
  if (0 < (long)p->nObjs) {
    lVar6 = 0;
    uVar3 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        uVar3 = 0;
        break;
      }
      uVar4 = *(undefined8 *)(&p->pObjs->field_0x0 + lVar6);
      uVar5 = (uint)((ulong)uVar4 >> 0x3f);
      if ((~(uint)uVar4 & 0x1fffffff) == 0) {
        uVar5 = 0;
      }
      if ((int)(uint)uVar4 < 0) {
        uVar5 = 0;
      }
      uVar3 = uVar3 + uVar5;
      lVar6 = lVar6 + 0xc;
    } while ((long)p->nObjs * 0xc != lVar6);
  }
  Abc_Print((int)uVar4,"Marked AND nodes = %6d.  ",(ulong)uVar3);
  level = 3;
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar6 - lVar2) / 1000000.0);
  return;
}

Assistant:

void Ga2_ManComputeTest( Gia_Man_t * p )
{
    abctime clk;
//    unsigned uTruth;
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    clk = Abc_Clock();
    Ga2_ManMarkup( p, 5, 0 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !pObj->fPhase )
            continue;
//        uTruth = Ga2_ObjTruth( p, pObj );
//        printf( "%6d : ", Counter );
//        Kit_DsdPrintFromTruth( &uTruth, Ga2_ObjLeaveNum(p, pObj) ); 
//        printf( "\n" );
        Counter++;
    }
    Abc_Print( 1, "Marked AND nodes = %6d.  ", Counter );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}